

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void handle_queued_messages(CManager_conflict cm,void *vmaster)

{
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  EVmaster in_RSI;
  CManager in_RDI;
  timespec ts_3;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  EVmaster_msg_ptr *last_ptr;
  EVmaster_msg_ptr next;
  EVmaster master;
  FILE *in_stack_ffffffffffffff70;
  FILE *in_stack_ffffffffffffff88;
  CMTraceType trace_type;
  CManager in_stack_ffffffffffffff90;
  timespec local_68;
  timespec local_58;
  timespec local_48;
  timespec local_38;
  EVmaster_msg_ptr *local_28;
  _EVmaster_msg *local_20;
  EVmaster local_18;
  CManager local_8;
  
  if (in_RSI->queued_messages != (EVmaster_msg_ptr)0x0) {
    local_18 = in_RSI;
    local_8 = in_RDI;
    iVar2 = CManager_locked(in_RDI);
    if (iVar2 == 0) {
      __assert_fail("CManager_locked(cm)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                    ,0xfc,"void handle_queued_messages(CManager, void *)");
    }
    local_20 = local_18->queued_messages;
    local_28 = &local_18->queued_messages;
    while (trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff88 >> 0x20),
          local_20 != (_EVmaster_msg *)0x0) {
      iVar2 = CMtrace_val[0xd];
      if (local_8->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(in_stack_ffffffffffffff90,trace_type);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          in_stack_ffffffffffffff88 = (FILE *)local_8->CMTrace_file;
          _Var3 = getpid();
          in_stack_ffffffffffffff90 = (CManager)(long)_Var3;
          pVar4 = pthread_self();
          fprintf(in_stack_ffffffffffffff88,"P%lxT%lx - ",in_stack_ffffffffffffff90,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_38);
          fprintf((FILE *)local_8->CMTrace_file,"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
        }
        fprintf((FILE *)local_8->CMTrace_file,
                "EVDFG handle_queued_messages -  master DFG state is %s\n",
                str_state[local_18->state]);
      }
      fflush((FILE *)local_8->CMTrace_file);
      switch(action_model[local_18->state][local_20->msg_type]) {
      case 'H':
        iVar2 = CMtrace_val[0xd];
        if (local_8->CMTrace_file == (FILE *)0x0) {
          iVar2 = CMtrace_init(in_stack_ffffffffffffff90,
                               (CMTraceType)((ulong)in_stack_ffffffffffffff88 >> 0x20));
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            in_stack_ffffffffffffff70 = (FILE *)local_8->CMTrace_file;
            _Var3 = getpid();
            pVar4 = pthread_self();
            fprintf(in_stack_ffffffffffffff70,"P%lxT%lx - ",(long)_Var3,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_48);
            fprintf((FILE *)local_8->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
          }
          fprintf((FILE *)local_8->CMTrace_file,"Master Message is type %s, calling handler\n",
                  master_msg_str[local_20->msg_type]);
        }
        fflush((FILE *)local_8->CMTrace_file);
        *local_28 = local_20->next;
        (*master_msg_handler[local_20->msg_type])(local_18,local_20);
        free_master_msg((EVmaster_msg *)in_stack_ffffffffffffff70);
        local_20 = local_18->queued_messages;
        break;
      default:
        printf("Unexpected action type \'%c\', discarding\n",
               (ulong)(uint)(int)action_model[local_18->state][local_20->msg_type]);
      case 'I':
        *local_28 = local_20->next;
        free_master_msg((EVmaster_msg *)in_stack_ffffffffffffff70);
        local_20 = *local_28;
        break;
      case 'Q':
        printf("Master Message is type %s, not appropriate now, leaving queued...\n",
               master_msg_str[local_20->msg_type]);
        local_20 = local_20->next;
        break;
      case 'U':
        printf("Master Message is type %s, UNEXPECTED!  Discarding...\n",
               master_msg_str[local_20->msg_type]);
        *local_28 = local_20->next;
        free_master_msg((EVmaster_msg *)in_stack_ffffffffffffff70);
        local_20 = *local_28;
      }
      iVar2 = CMtrace_val[0xd];
      if (local_8->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(in_stack_ffffffffffffff90,
                             (CMTraceType)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)local_8->CMTrace_file;
          _Var3 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_58);
          fprintf((FILE *)local_8->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
        }
        fprintf((FILE *)local_8->CMTrace_file,
                "EVDFG handle queued end loop -  master DFG state is now %s\n",
                str_state[local_18->state]);
      }
      fflush((FILE *)local_8->CMTrace_file);
    }
    iVar2 = CMtrace_val[0xd];
    if (local_8->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(in_stack_ffffffffffffff90,trace_type);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)local_8->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_68);
        fprintf((FILE *)local_8->CMTrace_file,"%lld.%.9ld - ",local_68.tv_sec,local_68.tv_nsec);
      }
      fprintf((FILE *)local_8->CMTrace_file,
              "EVDFG handle queued exiting -  master DFG state is now %s\n",
              str_state[local_18->state]);
    }
    fflush((FILE *)local_8->CMTrace_file);
  }
  return;
}

Assistant:

static void
handle_queued_messages(CManager cm, void* vmaster)
{
    /* SHOULD */
    /*  1 - consolidate node failure messages (likely to get several for each node) and handle these first */
    /*  2 -  handle node join messages last */
    /* FOR THE MOMENT */
    /* just do everything in order */
    /* beware the the list might change while we're running a handler */
    EVmaster master = (EVmaster) vmaster;
    EVmaster_msg_ptr next;
    EVmaster_msg_ptr *last_ptr;

    if (master->queued_messages == NULL) return;
    assert(CManager_locked(cm));
    next = master->queued_messages;
    last_ptr = &master->queued_messages;
    while(next != NULL) {
	CMtrace_out(cm, EVdfgVerbose, "EVDFG handle_queued_messages -  master DFG state is %s\n", str_state[master->state]);
	switch (action_model[master->state][next->msg_type]) {
	case 'H':
	    CMtrace_out(cm, EVdfgVerbose, "Master Message is type %s, calling handler\n", master_msg_str[next->msg_type]);
	    *last_ptr = next->next;  /* remove msg from queue */
	    (*master_msg_handler[next->msg_type])(master, next);
	    free_master_msg(next);
	    next = master->queued_messages;   /* start from scratch in case state changed */
	    break;
	case 'U':
	    printf("Master Message is type %s, UNEXPECTED!  Discarding...\n", master_msg_str[next->msg_type]);
	    *last_ptr = next->next;  /* remove msg from queue */
	    free_master_msg(next);
	    next = *last_ptr;
	    break;
	case 'Q':
	    printf("Master Message is type %s, not appropriate now, leaving queued...\n", master_msg_str[next->msg_type]);
	    next = next->next;
	    break;
	default:
	    printf("Unexpected action type '%c', discarding\n", action_model[master->state][next->msg_type]);
	    /* falling through */
	case 'I':
	    *last_ptr = next->next;  /* remove msg from queue */
	    free_master_msg(next);
	    next = *last_ptr;
	    break;
	}
	CMtrace_out(cm, EVdfgVerbose, "EVDFG handle queued end loop -  master DFG state is now %s\n", str_state[master->state]);
    }	    
    CMtrace_out(cm, EVdfgVerbose, "EVDFG handle queued exiting -  master DFG state is now %s\n", str_state[master->state]);
}